

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_read_le(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  size_t offset;
  size_t i;
  size_t limbs;
  size_t input_length_local;
  uchar *input_local;
  size_t X_limbs_local;
  mbedtls_mpi_uint *X_local;
  
  if (X_limbs < (input_length >> 3) + (long)(int)(uint)((input_length & 7) != 0)) {
    X_local._4_4_ = -8;
  }
  else {
    if (X != (mbedtls_mpi_uint *)0x0) {
      memset(X,0,X_limbs << 3);
      for (offset = 0; offset < input_length; offset = offset + 1) {
        X[offset >> 3] = (ulong)input[offset] << (sbyte)((offset & 7) << 3) | X[offset >> 3];
      }
    }
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_core_read_le(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    if (X != NULL) {
        memset(X, 0, X_limbs * ciL);

        for (size_t i = 0; i < input_length; i++) {
            size_t offset = ((i % ciL) << 3);
            X[i / ciL] |= ((mbedtls_mpi_uint) input[i]) << offset;
        }
    }

    return 0;
}